

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint32 uVar2;
  cmd_ln_t *pcVar3;
  char *pcVar4;
  long lVar5;
  char **ppcVar6;
  char *pcVar7;
  uint32 *in_n_seg;
  uint32 *local_118;
  uint32 *local_110;
  uint32 local_104;
  uint32 *local_c8;
  uint32 *local_c0;
  uint32 local_b4;
  int32 *local_68;
  int32 *cb2mllr;
  uint32 *ts2cb;
  uint32 **n_frame;
  uint32 *n_seg;
  char *pcStack_40;
  segdmp_type_t dmp_type;
  char *segtype;
  feat_t *feat;
  model_def_t *mdef;
  lexicon_t *lex;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  lex = (lexicon_t *)argv;
  argv_local._0_4_ = argc;
  parse_cmd_ln(argc,argv);
  iVar1 = initialize((lexicon_t **)&mdef,(model_def_t **)&feat,(feat_t **)&segtype,
                     (uint32 **)&cb2mllr,&local_68,(segdmp_type_t *)((long)&n_seg + 4));
  if (iVar1 != 0) {
    exit(1);
  }
  pcVar3 = cmd_ln_get();
  pcStack_40 = cmd_ln_str_r(pcVar3,"-segtype");
  iVar1 = strcmp(pcStack_40,"all");
  if (iVar1 == 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
            ,0x1ab,"Writing frames to one file\n");
    pcVar3 = cmd_ln_get();
    pcVar4 = cmd_ln_str_r(pcVar3,"-segdmpfn");
    pcVar3 = cmd_ln_get();
    lVar5 = cmd_ln_int_r(pcVar3,"-stride");
    iVar1 = agg_all_seg((feat_t *)segtype,n_seg._4_4_,pcVar4,(uint32)lVar5);
    if (iVar1 != 0) {
      exit(1);
    }
  }
  else {
    iVar1 = strcmp(pcStack_40,"st");
    if (iVar1 == 0) {
      pcVar3 = cmd_ln_get();
      lVar5 = cmd_ln_int_r(pcVar3,"-cachesz");
      segdmp_set_bufsz((uint32)lVar5);
      pcVar3 = cmd_ln_get();
      ppcVar6 = cmd_ln_str_list_r(pcVar3,"-segdmpdirs");
      pcVar3 = cmd_ln_get();
      pcVar4 = cmd_ln_str_r(pcVar3,"-segdmpfn");
      pcVar3 = cmd_ln_get();
      pcVar7 = cmd_ln_str_r(pcVar3,"-segidxfn");
      uVar2 = *(uint32 *)((long)&feat->stream_len + 4);
      in_n_seg = cnt_st((model_def_t *)feat,(lexicon_t *)mdef);
      if (*(int *)(segtype + 0x24) == 0) {
        local_b4 = *(uint32 *)(segtype + 0x14);
      }
      else {
        local_b4 = *(uint32 *)(segtype + 0x24);
      }
      if (*(long *)(segtype + 0x80) == 0) {
        if (*(long *)(segtype + 0x28) == 0) {
          local_c8 = *(uint32 **)(segtype + 0x18);
        }
        else {
          local_c8 = *(uint32 **)(segtype + 0x28);
        }
        local_c0 = local_c8;
      }
      else {
        local_c0 = (uint32 *)(segtype + 0x8c);
      }
      iVar1 = segdmp_open_write(ppcVar6,pcVar4,pcVar7,uVar2,in_n_seg,(uint32 **)0x0,n_seg._4_4_,
                                local_b4,local_c0,*(uint32 *)(segtype + 0x8c));
      if (iVar1 != 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                ,0x1c1,"Unable to initialize segment dump\n");
        exit(1);
      }
      iVar1 = agg_st_seg((model_def_t *)feat,(lexicon_t *)mdef,(feat_t *)segtype,(uint32 *)cb2mllr,
                         local_68,n_seg._4_4_);
      if (iVar1 != 0) {
        exit(1);
      }
      segdmp_close();
    }
    else {
      iVar1 = strcmp(pcStack_40,"phn");
      if (iVar1 != 0) {
        iVar1 = strcmp(pcStack_40,"wrd");
        if (iVar1 == 0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                  ,0x1e3,"Unimplememented -segtype wrd\n");
          exit(1);
        }
        iVar1 = strcmp(pcStack_40,"utt");
        if (iVar1 != 0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                  ,0x1e9,"Unhandled -segtype %s\n",pcStack_40);
          exit(1);
        }
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                ,0x1e6,"Unimplememented -segtype utt\n");
        exit(1);
      }
      pcVar3 = cmd_ln_get();
      lVar5 = cmd_ln_int_r(pcVar3,"-cachesz");
      segdmp_set_bufsz((uint32)lVar5);
      cnt_phn((model_def_t *)feat,(lexicon_t *)mdef,(uint32 **)&n_frame,(uint32 ***)&ts2cb);
      pcVar3 = cmd_ln_get();
      ppcVar6 = cmd_ln_str_list_r(pcVar3,"-segdmpdirs");
      pcVar3 = cmd_ln_get();
      pcVar4 = cmd_ln_str_r(pcVar3,"-segdmpfn");
      pcVar3 = cmd_ln_get();
      pcVar7 = cmd_ln_str_r(pcVar3,"-segidxfn");
      uVar2 = acmod_set_n_acmod(*(acmod_set_t **)feat);
      if (*(int *)(segtype + 0x24) == 0) {
        local_104 = *(uint32 *)(segtype + 0x14);
      }
      else {
        local_104 = *(uint32 *)(segtype + 0x24);
      }
      if (*(long *)(segtype + 0x80) == 0) {
        if (*(long *)(segtype + 0x28) == 0) {
          local_118 = *(uint32 **)(segtype + 0x18);
        }
        else {
          local_118 = *(uint32 **)(segtype + 0x28);
        }
        local_110 = local_118;
      }
      else {
        local_110 = (uint32 *)(segtype + 0x8c);
      }
      iVar1 = segdmp_open_write(ppcVar6,pcVar4,pcVar7,uVar2,(uint32 *)n_frame,(uint32 **)ts2cb,
                                n_seg._4_4_,local_104,local_110,*(uint32 *)(segtype + 0x8c));
      if (iVar1 != 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                ,0x1d9,"Unable to initialize segment dump\n");
        exit(1);
      }
      iVar1 = agg_phn_seg((lexicon_t *)mdef,*(acmod_set_t **)feat,(feat_t *)segtype,n_seg._4_4_);
      if (iVar1 != 0) {
        exit(1);
      }
      segdmp_close();
    }
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    lexicon_t *lex;
    model_def_t *mdef;
    feat_t *feat;
    const char *segtype;
    segdmp_type_t dmp_type;
    uint32 *n_seg;
    uint32 **n_frame;
    uint32 *ts2cb;
    int32 *cb2mllr;
    /*eov*/

    parse_cmd_ln(argc, argv);

    if (initialize(&lex, &mdef, &feat, &ts2cb, &cb2mllr, &dmp_type) != S3_SUCCESS) {
	exit(1);
    }

    segtype = cmd_ln_str("-segtype");

    if (strcmp(segtype, "all") == 0) {
	E_INFO("Writing frames to one file\n");

	if (agg_all_seg(feat,
			dmp_type,
			cmd_ln_str("-segdmpfn"),
			cmd_ln_int32("-stride")) != S3_SUCCESS) {
	    exit(1);
	}
    }
    else if (strcmp(segtype, "st") == 0) {
	segdmp_set_bufsz(cmd_ln_int32("-cachesz"));
	
	if (segdmp_open_write(cmd_ln_str_list("-segdmpdirs"),
			      cmd_ln_str("-segdmpfn"),
			      cmd_ln_str("-segidxfn"),
			      mdef->n_tied_state,
			      cnt_st(mdef, lex),
			      NULL,
			      dmp_type,
			      feat_dimension1(feat),
			      feat_stream_lengths(feat),
			      feat_dimension(feat)) != S3_SUCCESS) {
	    E_FATAL("Unable to initialize segment dump\n");
	}
	
	if (agg_st_seg(mdef, lex, feat, ts2cb, cb2mllr, dmp_type) != S3_SUCCESS) {
	    exit(1);
	}
	
	segdmp_close();
    }
    else if (strcmp(segtype, "phn") == 0) {
	segdmp_set_bufsz(cmd_ln_int32("-cachesz"));
	
	cnt_phn(mdef, lex, &n_seg, &n_frame);

	if (segdmp_open_write(cmd_ln_str_list("-segdmpdirs"),
			      cmd_ln_str("-segdmpfn"),
			      cmd_ln_str("-segidxfn"),
			      acmod_set_n_acmod(mdef->acmod_set),
			      n_seg,
			      n_frame,
			      dmp_type,
			      feat_dimension1(feat),
			      feat_stream_lengths(feat),
			      feat_dimension(feat)) != S3_SUCCESS) {
	    E_FATAL("Unable to initialize segment dump\n");
	}
	
	if (agg_phn_seg(lex, mdef->acmod_set, feat, dmp_type) != S3_SUCCESS) {
	    exit(1);
	}
	
	segdmp_close();
    }
    else if (strcmp(segtype, "wrd") == 0) {
	E_FATAL("Unimplememented -segtype wrd\n");
    }
    else if (strcmp(segtype, "utt") == 0) {
	E_FATAL("Unimplememented -segtype utt\n");
    }
    else {
	E_FATAL("Unhandled -segtype %s\n", segtype);
    }

    return 0;
}